

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void shift_reg_imm(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dst,TCGv_i64 src,int sf,
                  a64_shift_type shift_type,uint shift_i)

{
  TCGv_i64 shift_amount;
  uintptr_t o;
  
  if ((uint)(sf != 0) * 0x20 + 0x20 <= shift_i) {
    __assert_fail("shift_i < (sf ? 64 : 32)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x1144,
                  "void shift_reg_imm(TCGContext *, TCGv_i64, TCGv_i64, int, enum a64_shift_type, unsigned int)"
                 );
  }
  if (shift_i != 0) {
    shift_amount = tcg_const_i64_aarch64(tcg_ctx,(ulong)shift_i);
    shift_reg(tcg_ctx,dst,src,sf,shift_type,shift_amount);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(shift_amount + (long)tcg_ctx));
    return;
  }
  tcg_gen_mov_i64_aarch64(tcg_ctx,dst,src);
  return;
}

Assistant:

static void shift_reg_imm(TCGContext *tcg_ctx, TCGv_i64 dst, TCGv_i64 src, int sf,
                          enum a64_shift_type shift_type, unsigned int shift_i)
{
    assert(shift_i < (sf ? 64 : 32));

    if (shift_i == 0) {
        tcg_gen_mov_i64(tcg_ctx, dst, src);
    } else {
        TCGv_i64 shift_const;

        shift_const = tcg_const_i64(tcg_ctx, shift_i);
        shift_reg(tcg_ctx, dst, src, sf, shift_type, shift_const);
        tcg_temp_free_i64(tcg_ctx, shift_const);
    }
}